

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

bool logistic_check(double param_1,double b)

{
  double b_local;
  double param_0_local;
  
  if (0.0 >= b) {
    std::operator<<((ostream *)&std::cout," \n");
    std::operator<<((ostream *)&std::cout,"LOGISTIC_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cout,"  B <= 0.\n");
  }
  return 0.0 < b;
}

Assistant:

bool logistic_check ( double /*a*/, double b )

//****************************************************************************80
//
//  Purpose:
//
//    LOGISTIC_CHECK checks the parameters of the Logistic CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < B.
//
//    Output, bool LOGISTIC_CHECK, is true if the parameters are legal.
//
{
  if ( b <= 0.0 )
  {
    cout << " \n";
    cout << "LOGISTIC_CHECK - Warning!\n";
    cout << "  B <= 0.\n";
    return false;
  }
  return true;
}